

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRouterById
          (Registry *this,BorderRouterId *aRouterId)

{
  uint32_t *this_00;
  int iVar1;
  size_type sVar2;
  undefined1 local_488 [8];
  Network nwk;
  undefined1 local_420 [8];
  Network brNetwork;
  BorderRouter pred;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  routers;
  undefined1 local_210 [8];
  Network current;
  BorderRouter br;
  Status status;
  BorderRouterId *aRouterId_local;
  Registry *this_local;
  
  BorderRouter::BorderRouter((BorderRouter *)&current.mCcm);
  Network::Network((Network *)local_210);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            *)&pred.mAgent.mPresentFlags);
  BorderRouter::BorderRouter((BorderRouter *)&brNetwork.mCcm);
  iVar1 = (*this->mStorage->_vptr_PersistentStorage[0xf])(this->mStorage,aRouterId,&current.mCcm);
  br.mAgent._375_1_ = anon_unknown_0::MapStatus((Status)iVar1);
  if (br.mAgent._375_1_ == kSuccess) {
    br.mAgent._375_1_ = GetCurrentNetwork(this,(Network *)local_210);
    if ((br.mAgent._375_1_ == kSuccess) && (local_210._0_4_ != 0xffffffff)) {
      Network::Network((Network *)local_420);
      iVar1 = (*this->mStorage->_vptr_PersistentStorage[0xf])
                        (this->mStorage,aRouterId,&current.mCcm);
      br.mAgent._375_1_ = anon_unknown_0::MapStatus((Status)iVar1);
      if (br.mAgent._375_1_ == kSuccess) {
        iVar1 = (*this->mStorage->_vptr_PersistentStorage[0xe])
                          (this->mStorage,(undefined1 *)((long)&br._vptr_BorderRouter + 4),local_420
                          );
        br.mAgent._375_1_ = anon_unknown_0::MapStatus((Status)iVar1);
        if (br.mAgent._375_1_ == kSuccess) {
          if (brNetwork.mName.field_2._8_8_ == current.mName.field_2._8_8_) {
            pred._vptr_BorderRouter._4_4_ = local_420._0_4_;
            iVar1 = (*this->mStorage->_vptr_PersistentStorage[0x17])
                              (this->mStorage,&brNetwork.mCcm,&pred.mAgent.mPresentFlags);
            br.mAgent._375_1_ = anon_unknown_0::MapStatus((Status)iVar1);
            if (br.mAgent._375_1_ == kSuccess) {
              sVar2 = std::
                      vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ::size((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              *)&pred.mAgent.mPresentFlags);
              if (1 < sVar2) goto LAB_002ad223;
              br.mAgent._375_1_ = 5;
              nwk._92_4_ = 4;
            }
            else {
              nwk._92_4_ = 4;
            }
          }
          else {
LAB_002ad223:
            nwk._92_4_ = 0;
          }
        }
        else {
          nwk._92_4_ = 4;
        }
      }
      else {
        nwk._92_4_ = 4;
      }
      Network::~Network((Network *)local_420);
      if (nwk._92_4_ == 0) goto LAB_002ad261;
joined_r0x002ad254:
      if (nwk._92_4_ != 4) goto LAB_002ad492;
    }
    else {
LAB_002ad261:
      iVar1 = (*this->mStorage->_vptr_PersistentStorage[0xb])(this->mStorage,aRouterId);
      br.mAgent._375_1_ = anon_unknown_0::MapStatus((Status)iVar1);
      if (br._vptr_BorderRouter._4_4_ != 0xffffffff) {
        this_00 = &pred.mAgent.mPresentFlags;
        std::
        vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ::clear((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 *)this_00);
        pred._vptr_BorderRouter._4_4_ = br._vptr_BorderRouter._4_4_;
        iVar1 = (*this->mStorage->_vptr_PersistentStorage[0x17])
                          (this->mStorage,&brNetwork.mCcm,this_00);
        br.mAgent._375_1_ = anon_unknown_0::MapStatus((Status)iVar1);
        if (br.mAgent._375_1_ == kNotFound) {
          Network::Network((Network *)local_488);
          iVar1 = (*this->mStorage->_vptr_PersistentStorage[0xe])
                            (this->mStorage,(undefined1 *)((long)&br._vptr_BorderRouter + 4),
                             local_488);
          br.mAgent._375_1_ = anon_unknown_0::MapStatus((Status)iVar1);
          if (br.mAgent._375_1_ == kSuccess) {
            iVar1 = (*this->mStorage->_vptr_PersistentStorage[10])
                              (this->mStorage,(undefined1 *)((long)&br._vptr_BorderRouter + 4));
            br.mAgent._375_1_ = anon_unknown_0::MapStatus((Status)iVar1);
            if (br.mAgent._375_1_ == kSuccess) {
              br.mAgent._375_1_ = DropDomainIfEmpty(this,(DomainId *)(local_488 + 4));
              if (br.mAgent._375_1_ == kSuccess) {
                nwk._92_4_ = 0;
              }
              else {
                nwk._92_4_ = 4;
              }
            }
            else {
              nwk._92_4_ = 4;
            }
          }
          else {
            nwk._92_4_ = 4;
          }
          Network::~Network((Network *)local_488);
          if (nwk._92_4_ != 0) goto joined_r0x002ad254;
        }
      }
    }
  }
  this_local._7_1_ = br.mAgent._375_1_;
  nwk._92_4_ = 1;
LAB_002ad492:
  BorderRouter::~BorderRouter((BorderRouter *)&brNetwork.mCcm);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             *)&pred.mAgent.mPresentFlags);
  Network::~Network((Network *)local_210);
  BorderRouter::~BorderRouter((BorderRouter *)&current.mCcm);
  return this_local._7_1_;
}

Assistant:

Registry::Status Registry::DeleteBorderRouterById(const BorderRouterId &aRouterId)
{
    Registry::Status          status;
    BorderRouter              br;
    Network                   current;
    std::vector<BorderRouter> routers;
    BorderRouter              pred;

    VerifyOrExit((status = MapStatus(mStorage->Get(aRouterId, br))) == Registry::Status::kSuccess);

    status = GetCurrentNetwork(current);
    if (status == Registry::Status::kSuccess && (current.mId.mId != EMPTY_ID))
    {
        Network brNetwork;
        // Check we don't delete the last border router in the current network
        VerifyOrExit((status = MapStatus(mStorage->Get(aRouterId, br))) == Registry::Status::kSuccess);
        VerifyOrExit((status = MapStatus(mStorage->Get(br.mNetworkId, brNetwork))) == Registry::Status::kSuccess);
        if (brNetwork.mXpan == current.mXpan)
        {
            pred.mNetworkId = brNetwork.mId;
            VerifyOrExit((status = MapStatus(mStorage->Lookup(pred, routers))) == Registry::Status::kSuccess);
            VerifyOrExit(routers.size() > 1, status = Registry::Status::kRestricted);
        }
    }

    status = MapStatus(mStorage->Del(aRouterId));

    if (br.mNetworkId.mId != EMPTY_ID)
    {
        // Was it the last in the network?
        routers.clear();
        pred.mNetworkId = br.mNetworkId;
        status          = MapStatus(mStorage->Lookup(pred, routers));
        if (status == Registry::Status::kNotFound)
        {
            Network nwk;
            VerifyOrExit((status = MapStatus(mStorage->Get(br.mNetworkId, nwk))) == Registry::Status::kSuccess);
            VerifyOrExit((status = MapStatus(mStorage->Del(br.mNetworkId))) == Registry::Status::kSuccess);

            VerifyOrExit((status = DropDomainIfEmpty(nwk.mDomainId)) == Registry::Status::kSuccess);
        }
    }
exit:
    return status;
}